

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

Side * __thiscall Application::querySide(Side *__return_storage_ptr__,Application *this)

{
  ostream *poVar1;
  exception *this_00;
  CHAR local_1a;
  char local_19;
  Application *pAStack_18;
  char value;
  Application *this_local;
  
  pAStack_18 = this;
  this_local = (Application *)__return_storage_ptr__;
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"1) Buy");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"2) Sell");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"3) Sell Short");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"4) Sell Short Exempt");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"5) Cross");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"6) Cross Short");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"7) Cross Short Exempt");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar1,"Side: ");
  std::operator>>((istream *)&std::cin,&local_19);
  switch(local_19) {
  case '1':
    FIX::Side::Side(__return_storage_ptr__,"12568912340321511Application");
    break;
  case '2':
    FIX::Side::Side(__return_storage_ptr__,"2568912340321511Application");
    break;
  case '3':
    FIX::Side::Side(__return_storage_ptr__,"568912340321511Application");
    break;
  case '4':
    FIX::Side::Side(__return_storage_ptr__,"68912340321511Application");
    break;
  case '5':
    FIX::Side::Side(__return_storage_ptr__,"8912340321511Application");
    break;
  case '6':
    FIX::Side::Side(__return_storage_ptr__,"912340321511Application");
    break;
  case '7':
    local_1a = 'A';
    FIX::Side::Side(__return_storage_ptr__,&local_1a);
    break;
  default:
    this_00 = (exception *)__cxa_allocate_exception(8);
    std::exception::exception(this_00);
    __cxa_throw(this_00,&std::exception::typeinfo,std::exception::~exception);
  }
  return __return_storage_ptr__;
}

Assistant:

FIX::Side Application::querySide() {
  char value;
  std::cout << std::endl
            << "1) Buy" << std::endl
            << "2) Sell" << std::endl
            << "3) Sell Short" << std::endl
            << "4) Sell Short Exempt" << std::endl
            << "5) Cross" << std::endl
            << "6) Cross Short" << std::endl
            << "7) Cross Short Exempt" << std::endl
            << "Side: ";

  std::cin >> value;
  switch (value) {
  case '1':
    return FIX::Side(FIX::Side_BUY);
  case '2':
    return FIX::Side(FIX::Side_SELL);
  case '3':
    return FIX::Side(FIX::Side_SELL_SHORT);
  case '4':
    return FIX::Side(FIX::Side_SELL_SHORT_EXEMPT);
  case '5':
    return FIX::Side(FIX::Side_CROSS);
  case '6':
    return FIX::Side(FIX::Side_CROSS_SHORT);
  case '7':
    return FIX::Side('A');
  default:
    throw std::exception();
  }
}